

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O1

REF_STATUS ref_split_pass(REF_GRID ref_grid)

{
  REF_DBL *pRVar1;
  int *piVar2;
  int iVar3;
  REF_INT RVar4;
  int node1;
  int iVar5;
  REF_INT node1_00;
  REF_MPI pRVar6;
  REF_NODE pRVar7;
  REF_INT *pRVar8;
  uint uVar9;
  uint uVar10;
  REF_STATUS RVar11;
  REF_CELL *ppRVar12;
  undefined8 uVar13;
  REF_STATUS ref_private_macro_code_rss;
  long lVar14;
  char *pcVar15;
  double dVar16;
  double dVar17;
  REF_INT new_node;
  REF_CAVITY ref_cavity;
  REF_BOOL allowed;
  REF_EDGE ref_edge;
  REF_SUBDIV ref_subdiv;
  REF_LIST para_no_geom;
  REF_BOOL has_edge;
  REF_LIST para_cavity;
  REF_DBL ratio01;
  REF_INT n_cavity;
  REF_BOOL allowed_tri_quality;
  REF_BOOL allowed_cavity_ratio;
  REF_BOOL geom_support;
  REF_BOOL allowed_local;
  REF_BOOL allowed_tet_quality;
  REF_BOOL allowed_tri_conformity;
  REF_BOOL allowed_ratio;
  REF_DBL ratio1;
  REF_DBL ratio0;
  REF_GLOB global;
  REF_DBL min_add;
  REF_DBL min_del;
  uint local_118;
  REF_INT local_114;
  REF_NODE local_110;
  REF_CAVITY local_108;
  int local_100;
  uint local_fc;
  REF_EDGE local_f8;
  REF_SUBDIV local_f0;
  REF_LIST local_e8;
  int local_dc;
  double local_d8;
  undefined8 uStack_d0;
  REF_LIST local_c8;
  long local_c0;
  REF_INT *local_b8;
  void *local_b0;
  REF_DBL *local_a8;
  double local_a0;
  uint local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  long local_78;
  REF_MPI local_70;
  REF_CELL local_68;
  REF_CELL *local_60;
  double local_58;
  double local_50;
  REF_GLOB local_48;
  double local_40;
  REF_DBL local_38;
  
  pRVar6 = ref_grid->mpi;
  pRVar7 = ref_grid->node;
  local_60 = ref_grid->cell + 8;
  local_108 = (REF_CAVITY)0x0;
  local_e8 = (REF_LIST)0x0;
  local_c8 = (REF_LIST)0x0;
  local_f0 = (REF_SUBDIV)0x0;
  if ((ref_grid->twod != 0) || (ppRVar12 = local_60, ref_grid->surf != 0)) {
    ppRVar12 = ref_grid->cell + 3;
  }
  uVar10 = 0;
  if ((ref_grid->twod == 0) && (1 < pRVar6->n)) {
    uVar10 = (uint)(ref_grid->surf == 0);
  }
  local_68 = *ppRVar12;
  if ((char)uVar10 != '\0') {
    uVar9 = ref_list_create(&local_e8);
    if (uVar9 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x6d,
             "ref_split_pass",(ulong)uVar9,"list for stuck edges");
      return uVar9;
    }
    uVar9 = ref_list_create(&local_c8);
    local_118 = 0;
    if (uVar9 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x6e,
             "ref_split_pass",(ulong)uVar9,"list for stuck cavity");
      return uVar9;
    }
  }
  local_fc = uVar10;
  uVar10 = ref_edge_create(&local_f8,ref_grid);
  if (uVar10 == 0) {
    lVar14 = (long)local_f8->n;
    if (lVar14 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x73,
             "ref_split_pass","malloc ratio of REF_DBL negative");
      local_118 = 1;
    }
    else {
      local_a8 = (REF_DBL *)malloc(lVar14 * 8);
      if (local_a8 == (REF_DBL *)0x0) {
        pcVar15 = "malloc ratio of REF_DBL NULL";
        uVar13 = 0x73;
      }
      else {
        local_b8 = (REF_INT *)malloc(lVar14 << 2);
        if (local_b8 == (REF_INT *)0x0) {
          pcVar15 = "malloc order of REF_INT NULL";
          uVar13 = 0x74;
        }
        else {
          local_b0 = malloc(lVar14 << 2);
          if (local_b0 != (void *)0x0) {
            local_110 = pRVar7;
            local_70 = pRVar6;
            if (local_f8->n < 1) {
              uVar10 = 0;
            }
            else {
              lVar14 = 0;
              uVar10 = 0;
              do {
                pRVar1 = local_a8 + (int)uVar10;
                uVar9 = ref_node_ratio(local_110,local_f8->e2n[lVar14 * 2],
                                       local_f8->e2n[lVar14 * 2 + 1],pRVar1);
                if (uVar9 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                         ,0x7b,"ref_split_pass",(ulong)uVar9,"ratio");
                  return uVar9;
                }
                dVar17 = *pRVar1;
                pRVar1 = &ref_grid->adapt->split_ratio;
                if (*pRVar1 <= dVar17 && dVar17 != *pRVar1) {
                  *(int *)((long)local_b0 + (long)(int)uVar10 * 4) = (int)lVar14;
                  uVar10 = uVar10 + 1;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < local_f8->n);
            }
            uVar9 = ref_sort_heap_dbl(uVar10,local_a8,local_b8);
            if (uVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x82,"ref_split_pass",(ulong)uVar9,"sort lengths");
              return uVar9;
            }
            if (0 < (int)uVar10) {
              lVar14 = (ulong)uVar10 + 1;
              do {
                iVar3 = *(int *)((long)local_b0 + (long)local_b8[lVar14 + -2] * 4);
                RVar4 = local_f8->e2n[(long)iVar3 * 2];
                node1 = local_f8->e2n[iVar3 * 2 + 1];
                uVar10 = ref_cell_has_side(local_68,RVar4,node1,&local_100);
                if (uVar10 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                         ,0x8c,"ref_split_pass",(ulong)uVar10,"has side");
                  return uVar10;
                }
                if (local_100 != 0) {
                  iVar5 = local_110->ref_mpi->id;
                  if ((iVar5 == local_110->part[RVar4]) || (iVar5 == local_110->part[node1])) {
                    local_c0 = (long)RVar4;
                    local_78 = (long)iVar3;
                    uVar10 = ref_split_edge_mixed(ref_grid,RVar4,node1,&local_100);
                    if (uVar10 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x96,"ref_split_pass",(ulong)uVar10,"mixed");
                      return uVar10;
                    }
                    if (local_100 != 0) {
                      if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
LAB_001c0d48:
                        local_d8 = 0.5;
                      }
                      else {
                        uVar10 = ref_node_ratio(local_110,RVar4,node1,&local_a0);
                        if (uVar10 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                 ,0x9c,"ref_split_pass",(ulong)uVar10,"ratio01");
                          return uVar10;
                        }
                        uVar10 = ref_node_ratio_node0(local_110,RVar4,node1,&local_50);
                        if (uVar10 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                 ,0x9d,"ref_split_pass",(ulong)uVar10,"ratio0");
                          return uVar10;
                        }
                        uVar10 = ref_node_ratio_node0(local_110,node1,RVar4,&local_58);
                        if (uVar10 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                 ,0x9e,"ref_split_pass",(ulong)uVar10,"ratio1");
                          return uVar10;
                        }
                        dVar17 = local_58 * 1e+20 + local_50;
                        if (dVar17 <= -dVar17) {
                          dVar17 = -dVar17;
                        }
                        dVar16 = local_50;
                        if (local_50 <= -local_50) {
                          dVar16 = -local_50;
                        }
                        if (dVar17 <= dVar16) goto LAB_001c0d48;
                        dVar17 = local_50 / (local_58 + local_50);
                        if ((dVar17 <= 0.25) || (0.75 <= dVar17)) {
                          dVar17 = local_a0 * 1e+20;
                          if (dVar17 <= -dVar17) {
                            dVar17 = -dVar17;
                          }
                          if (local_58 <= local_50) {
                            dVar16 = local_58;
                            if (local_58 <= -local_58) {
                              dVar16 = -local_58;
                            }
                            if (dVar17 <= dVar16) goto LAB_001c0d48;
                            local_d8 = local_58 / local_a0;
                          }
                          else {
                            if (dVar17 <= dVar16) goto LAB_001c0d48;
                            local_d8 = 1.0 - local_50 / local_a0;
                          }
                        }
                        else {
                          local_d8 = 1.0 - dVar17;
                        }
                      }
                      uStack_d0 = 0;
                      uVar10 = ref_node_next_global(local_110,&local_48);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xb1,"ref_split_pass",(ulong)uVar10,"next global");
                        return uVar10;
                      }
                      uVar10 = ref_node_add(local_110,local_48,&local_114);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xb2,"ref_split_pass",(ulong)uVar10,"new node");
                        return uVar10;
                      }
                      dVar17 = 0.05;
                      if (0.05 <= local_d8) {
                        dVar17 = local_d8;
                      }
                      local_d8 = 0.95;
                      if (dVar17 <= 0.95) {
                        local_d8 = dVar17;
                      }
                      uVar10 = ref_node_interpolate_edge(local_110,RVar4,node1,local_d8,local_114);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xb5,"ref_split_pass",(ulong)uVar10,"interp new node");
                        return uVar10;
                      }
                      uVar10 = ref_geom_add_between(ref_grid,RVar4,node1,local_d8,local_114);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xb7,"ref_split_pass",(ulong)uVar10,"geom new node");
                        return uVar10;
                      }
                      uVar10 = ref_geom_constrain(ref_grid,local_114);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xb8,"ref_split_pass",(ulong)uVar10,"geom constraint");
                        return uVar10;
                      }
                      uVar10 = ref_metric_interpolate_between(ref_grid,RVar4,node1,local_114);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xba,"ref_split_pass",(ulong)uVar10,"interp new node metric");
                        return uVar10;
                      }
                      uVar10 = ref_geom_supported(ref_grid->geom,local_114,&local_8c);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xbc,"ref_split_pass",(ulong)uVar10,"geom support");
                        return uVar10;
                      }
                      uVar10 = ref_split_edge_tet_quality(ref_grid,RVar4,node1,local_114,&local_84);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xdf,"ref_split_pass",(ulong)uVar10,"edge tet qual");
                        return uVar10;
                      }
                      uVar10 = ref_split_edge_tri_quality(ref_grid,RVar4,node1,local_114,&local_94);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xe4,"ref_split_pass",(ulong)uVar10,"quality of new tri");
                        return uVar10;
                      }
                      uVar10 = ref_split_edge_ratio(ref_grid,RVar4,node1,local_114,&local_7c);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xe8,"ref_split_pass",(ulong)uVar10,"edge tet ratio");
                        return uVar10;
                      }
                      uVar10 = ref_split_edge_tri_conformity
                                         (0,ref_grid,RVar4,node1,local_114,&local_80);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xed,"ref_split_pass",(ulong)uVar10,"edge tri qual");
                        return uVar10;
                      }
                      uVar10 = ref_cell_has_side(ref_grid->cell[0],RVar4,node1,&local_dc);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xf1,"ref_split_pass",(ulong)uVar10,"check for an edge");
                        return uVar10;
                      }
                      if ((((local_84 == 0) || (local_7c == 0)) || (local_80 == 0)) ||
                         (local_94 == 0)) {
                        if (local_8c == 0) {
                          uVar10 = ref_node_remove(local_110,local_114);
                          if (uVar10 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                   ,0xfa,"ref_split_pass",(ulong)uVar10,"remove new node");
                            return uVar10;
                          }
                          uVar10 = ref_geom_remove_all(ref_grid->geom,local_114);
                          if (uVar10 != 0) {
                            uVar13 = 0xfb;
                            goto LAB_001c1954;
                          }
                        }
                        else {
                          uVar10 = ref_cavity_create(&local_108);
                          if (uVar10 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                   ,0x101,"ref_split_pass",(ulong)uVar10,"cav create");
                            return uVar10;
                          }
                          local_108->debug = 0;
                          if ((ref_grid->surf != 0) && (local_dc != 0)) {
                            uVar10 = ref_node_ratio(local_110,RVar4,node1,&local_a0);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                     ,0x104,"ref_split_pass",(ulong)uVar10,"ratio01");
                              return uVar10;
                            }
                            if (5.0 < local_a0) {
                              local_108->min_normdev = 0.0;
                            }
                          }
                          uVar10 = ref_cavity_form_edge_split
                                             (local_108,ref_grid,RVar4,node1,local_114);
                          if (uVar10 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                   ,0x109,"ref_split_pass",(ulong)uVar10,"form edge split cav");
                            return uVar10;
                          }
                          RVar11 = ref_cavity_enlarge_combined(local_108);
                          if (RVar11 != 0) {
                            uVar10 = ref_grid_tattle(ref_grid,RVar4);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                     ,0x112,"ref_split_pass",(ulong)uVar10,"tattle node0");
                              return uVar10;
                            }
                            uVar10 = ref_grid_tattle(ref_grid,node1);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                     ,0x113,"ref_split_pass",(ulong)uVar10,"tattle node1");
                              return uVar10;
                            }
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                   ,0x114,"ref_split_pass","enlarge");
                          }
                          if (local_108->state == REF_CAVITY_VISIBLE) {
                            uVar10 = ref_cavity_ratio(local_108,&local_90);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                     ,0x119,"ref_split_pass",(ulong)uVar10,"cavity ratio");
                              return uVar10;
                            }
                            uVar10 = ref_cavity_change(local_108,&local_38,&local_40);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                     ,0x11a,"ref_split_pass",(ulong)uVar10,"cavity change");
                              return uVar10;
                            }
                            if ((local_dc != 0 || local_90 != 0) &&
                               (pRVar1 = &ref_grid->adapt->split_quality_absolute,
                               *pRVar1 <= local_40 && local_40 != *pRVar1)) {
                              uVar10 = ref_cavity_replace(local_108);
                              if (uVar10 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                       ,0x126,"ref_split_pass",(ulong)uVar10,"cav replace");
                                return uVar10;
                              }
                              uVar10 = ref_cavity_free(local_108);
                              if (uVar10 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                       ,0x127,"ref_split_pass",(ulong)uVar10,"cav free");
                                return uVar10;
                              }
                              local_108 = (REF_CAVITY)0x0;
                              pRVar8 = local_110->age;
                              pRVar8[local_c0] = 0;
                              pRVar8[node1] = 0;
                              uVar10 = ref_smooth_post_edge_split(ref_grid,local_114);
                              if (uVar10 != 0) {
                                uVar13 = 300;
                                goto LAB_001c1788;
                              }
                              goto LAB_001c196f;
                            }
                          }
                          if (((char)local_fc == '\x01' &&
                               local_108->state == REF_CAVITY_PARTITION_CONSTRAINED) &&
                             (uVar10 = ref_list_push(local_c8,(REF_INT)local_78), uVar10 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                   ,0x137,"ref_split_pass",(ulong)uVar10,"push");
                            return uVar10;
                          }
                          uVar10 = ref_cavity_free(local_108);
                          if (uVar10 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                   ,0x139,"ref_split_pass",(ulong)uVar10,"cav free");
                            return uVar10;
                          }
                          local_108 = (REF_CAVITY)0x0;
                          uVar10 = ref_node_remove(local_110,local_114);
                          if (uVar10 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                   ,0x13b,"ref_split_pass",(ulong)uVar10,"remove new node");
                            return uVar10;
                          }
                          uVar10 = ref_geom_remove_all(ref_grid->geom,local_114);
                          if (uVar10 != 0) {
                            uVar13 = 0x13c;
                            goto LAB_001c1954;
                          }
                        }
                      }
                      else {
                        uVar10 = ref_cell_local_gem(local_68,local_110,RVar4,node1,&local_88);
                        if (uVar10 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                 ,0x141,"ref_split_pass",(ulong)uVar10,"local tet");
                          return uVar10;
                        }
                        if (local_88 == 0) {
                          if ((char)local_fc == '\0') {
                            pRVar8 = local_110->age;
                            piVar2 = pRVar8 + local_c0;
                            *piVar2 = *piVar2 + 1;
                            piVar2 = pRVar8 + node1;
                            *piVar2 = *piVar2 + 1;
                          }
                          else {
                            uVar10 = ref_list_push(local_e8,(REF_INT)local_78);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                     ,0x144,"ref_split_pass",(ulong)uVar10,"push");
                              return uVar10;
                            }
                          }
                          uVar10 = ref_node_remove(local_110,local_114);
                          if (uVar10 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                   ,0x149,"ref_split_pass",(ulong)uVar10,"remove new node");
                            return uVar10;
                          }
                          uVar10 = ref_geom_remove_all(ref_grid->geom,local_114);
                          if (uVar10 != 0) {
                            uVar13 = 0x14a;
LAB_001c1954:
                            pcVar15 = "rm";
LAB_001c1965:
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                   ,uVar13,"ref_split_pass",(ulong)uVar10,pcVar15);
                            local_118 = uVar10;
                          }
                        }
                        else {
                          uVar10 = ref_split_edge(ref_grid,RVar4,node1,local_114);
                          if (uVar10 == 7) {
                            uVar10 = ref_node_remove(local_110,local_114);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                     ,0x151,"ref_split_pass",(ulong)uVar10,"remove new node");
                              return uVar10;
                            }
                            uVar10 = ref_geom_remove_all(ref_grid->geom,local_114);
                            if (uVar10 != 0) {
                              uVar13 = 0x152;
                              goto LAB_001c1954;
                            }
                          }
                          else {
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                     ,0x155,"ref_split_pass",(ulong)uVar10,"tet edge split");
                              return uVar10;
                            }
                            pRVar8 = local_110->age;
                            pRVar8[local_c0] = 0;
                            pRVar8[node1] = 0;
                            uVar10 = ref_smooth_post_edge_split(ref_grid,local_114);
                            if (uVar10 != 0) {
                              uVar13 = 0x15d;
LAB_001c1788:
                              pcVar15 = "smooth after split";
                              goto LAB_001c1965;
                            }
                          }
                        }
                      }
LAB_001c196f:
                      if (uVar10 != 0) {
                        return local_118;
                      }
                    }
                  }
                }
                lVar14 = lVar14 + -1;
              } while (1 < lVar14);
            }
            free(local_b0);
            free(local_b8);
            free(local_a8);
            if ((char)local_fc != '\0') {
              if (0 < ref_grid->adapt->timing_level) {
                ref_mpi_stopwatch_stop(ref_grid->mpi,"spl int");
              }
              uVar10 = ref_subdiv_create(&local_f0,ref_grid);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x167,"ref_split_pass",(ulong)uVar10,"create");
                return uVar10;
              }
              local_f0->new_mark_allowed = 0;
              local_f0->instrument = 1;
              if (0 < local_e8->n) {
                lVar14 = 0;
                do {
                  RVar4 = local_f8->e2n[(long)local_e8->value[lVar14] * 2];
                  node1_00 = local_f8->e2n[local_e8->value[lVar14] * 2 + 1];
                  uVar10 = ref_cell_has_side(*local_60,RVar4,node1_00,&local_100);
                  if (uVar10 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x16f,"ref_split_pass",(ulong)uVar10,"has side");
                    return uVar10;
                  }
                  if ((local_100 != 0) &&
                     (uVar10 = ref_subdiv_mark_to_split(local_f0,RVar4,node1_00), uVar10 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x173,"ref_split_pass",(ulong)uVar10,"mark edge to para split");
                    return uVar10;
                  }
                  lVar14 = lVar14 + 1;
                } while (lVar14 < local_e8->n);
              }
              uVar10 = ref_subdiv_split(local_f0);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x176,"ref_split_pass",(ulong)uVar10,"split");
                return uVar10;
              }
              uVar10 = ref_subdiv_free(local_f0);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x177,"ref_split_pass",(ulong)uVar10,"free");
                return uVar10;
              }
              local_98 = local_c8->n;
              uVar10 = ref_mpi_allsum(local_70,&local_98,1,1);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x17c,"ref_split_pass",(ulong)uVar10,"cavs");
                return uVar10;
              }
              if (local_70->id == 0) {
                printf("cavities with part constraints %d\n",(ulong)local_98);
              }
              ref_list_free(local_e8);
              ref_list_free(local_c8);
            }
            ref_edge_free(local_f8);
            return 0;
          }
          pcVar15 = "malloc edges of REF_INT NULL";
          uVar13 = 0x75;
          local_b0 = (void *)0x0;
        }
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
             uVar13,"ref_split_pass",pcVar15);
      local_118 = 2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x71,
           "ref_split_pass",(ulong)uVar10,"orig edges");
    local_118 = uVar10;
  }
  return local_118;
}

Assistant:

REF_FCN REF_STATUS ref_split_pass(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT *edges, *order;
  REF_INT i, n, edge;
  REF_BOOL allowed_ratio, allowed_tri_conformity, allowed_tet_quality;
  REF_BOOL allowed, allowed_local, geom_support, valid_cavity, try_cavity;
  REF_BOOL allowed_cavity_ratio, has_edge;
  REF_BOOL allowed_tri_quality;
  REF_DBL min_del, min_add;
  REF_GLOB global;
  REF_INT node0, node1;
  REF_INT new_node;
  REF_CAVITY ref_cavity = (REF_CAVITY)NULL;
  REF_BOOL span_parts;
  REF_LIST para_no_geom = NULL;
  REF_LIST para_cavity = NULL;
  REF_SUBDIV ref_subdiv = NULL;
  REF_STATUS status;
  REF_BOOL transcript = REF_FALSE;
  REF_DBL ratio01, ratio0, ratio1, weight_node1;

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  span_parts = ref_mpi_para(ref_grid_mpi(ref_grid)) &&
               !ref_grid_twod(ref_grid) && !ref_grid_surf(ref_grid);

  if (span_parts) {
    RSS(ref_list_create(&para_no_geom), "list for stuck edges");
    RSS(ref_list_create(&para_cavity), "list for stuck cavity");
  }

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(ratio, ref_edge_n(ref_edge), REF_DBL);
  ref_malloc(order, ref_edge_n(ref_edge), REF_INT);
  ref_malloc(edges, ref_edge_n(ref_edge), REF_INT);

  n = 0;
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &(ratio[n])), "ratio");
    if (ratio[n] > ref_grid_adapt(ref_grid, split_ratio)) {
      edges[n] = edge;
      n++;
    }
  }

  RSS(ref_sort_heap_dbl(n, ratio, order), "sort lengths");

  for (i = n - 1; i >= 0; i--) {
    edge = edges[order[i]];
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);

    /* transcript = (ratio[order[i]] > 3.0); */
    if (transcript) printf("transcript on ratio %f\n", ratio[order[i]]);

    RSS(ref_cell_has_side(ref_cell, node0, node1, &allowed), "has side");
    if (transcript && !allowed) printf("not a side anymore\n");
    if (!allowed) continue;

    /* skip if neither node is owned */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1)) {
      if (transcript) printf("neither node is local\n");
      continue;
    }

    RSS(ref_split_edge_mixed(ref_grid, node0, node1, &allowed), "mixed");
    if (transcript && !allowed) printf("mixed edge\n");
    if (!allowed) continue;

    weight_node1 = 0.5;
    if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
      RSS(ref_node_ratio(ref_node, node0, node1, &ratio01), "ratio01");
      RSS(ref_node_ratio_node0(ref_node, node0, node1, &ratio0), "ratio0");
      RSS(ref_node_ratio_node0(ref_node, node1, node0, &ratio1), "ratio1");
      if (ref_math_divisible(ratio0, ratio1 + ratio0)) {
        if (0.25 < ratio0 / (ratio0 + ratio1) &&
            ratio0 / (ratio0 + ratio1) < 0.75) {
          weight_node1 = 1.0 - ratio0 / (ratio0 + ratio1);
        } else {
          if (ratio0 < ratio1) {
            if (ref_math_divisible(ratio0, ratio01))
              weight_node1 = 1.0 - ratio0 / ratio01;
          } else {
            if (ref_math_divisible(ratio1, ratio01))
              weight_node1 = ratio1 / ratio01;
          }
        }
      }
    }
    weight_node1 = MIN(0.95, MAX(0.05, weight_node1));
    if (transcript) printf("weight_node1 %f\n", weight_node1);

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &new_node), "new node");
    RSS(ref_node_interpolate_edge(ref_node, node0, node1, weight_node1,
                                  new_node),
        "interp new node");
    RSS(ref_geom_add_between(ref_grid, node0, node1, weight_node1, new_node),
        "geom new node");
    RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
    RSS(ref_metric_interpolate_between(ref_grid, node0, node1, new_node),
        "interp new node metric");
    RSS(ref_geom_supported(ref_grid_geom(ref_grid), new_node, &geom_support),
        "geom support");
    if (transcript && geom_support) printf("geom support\n");

    if (transcript) {
      REF_DBL d0, d1;
      d0 = sqrt(pow(ref_node_xyz(ref_node, 0, node0) -
                        ref_node_xyz(ref_node, 0, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 1, node0) -
                        ref_node_xyz(ref_node, 1, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 2, node0) -
                        ref_node_xyz(ref_node, 2, new_node),
                    2));
      d1 = sqrt(pow(ref_node_xyz(ref_node, 0, node1) -
                        ref_node_xyz(ref_node, 0, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 1, node1) -
                        ref_node_xyz(ref_node, 1, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 2, node1) -
                        ref_node_xyz(ref_node, 2, new_node),
                    2));
      printf("w1 %f xyz %f %f %f d %f %f\nbetween %f %f %f %f %f %f\n",
             weight_node1, ref_node_xyz(ref_node, 0, new_node),
             ref_node_xyz(ref_node, 1, new_node),
             ref_node_xyz(ref_node, 2, new_node), d0, d1,
             ref_node_xyz(ref_node, 0, node0), ref_node_xyz(ref_node, 1, node0),
             ref_node_xyz(ref_node, 2, node0), ref_node_xyz(ref_node, 0, node1),
             ref_node_xyz(ref_node, 1, node1),
             ref_node_xyz(ref_node, 2, node1));
    }

    RSS(ref_split_edge_tet_quality(ref_grid, node0, node1, new_node,
                                   &allowed_tet_quality),
        "edge tet qual");
    if (transcript && !allowed_tet_quality) printf("tet quality poor\n");

    RSS(ref_split_edge_tri_quality(ref_grid, node0, node1, new_node,
                                   &allowed_tri_quality),
        "quality of new tri");
    if (transcript && !allowed_tri_quality) printf("tri quality poor\n");

    RSS(ref_split_edge_ratio(ref_grid, node0, node1, new_node, &allowed_ratio),
        "edge tet ratio");
    if (transcript && !allowed_ratio) printf("ratio poor\n");

    RSS(ref_split_edge_tri_conformity(transcript, ref_grid, node0, node1,
                                      new_node, &allowed_tri_conformity),
        "edge tri qual");
    if (transcript && !allowed_tri_conformity) printf("tri conformity poor\n");

    RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node0, node1, &has_edge),
        "check for an edge");
    if (transcript && has_edge) printf("has geom edge\n");

    try_cavity = REF_FALSE;
    if (!allowed_tet_quality || !allowed_ratio || !allowed_tri_conformity ||
        !allowed_tri_quality) {
      if (geom_support) {
        try_cavity = REF_TRUE;
      } else {
        RSS(ref_node_remove(ref_node, new_node), "remove new node");
        RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
        continue;
      }
    }

    if (try_cavity) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      ref_cavity_debug(ref_cavity) = transcript;
      if (ref_grid_surf(ref_grid) && has_edge) {
        RSS(ref_node_ratio(ref_node, node0, node1, &ratio01), "ratio01");
        if (ratio01 > 5.0) ref_cavity_min_normdev(ref_cavity) = 0.0;
      }
      RSS(ref_cavity_form_edge_split(ref_cavity, ref_grid, node0, node1,
                                     new_node),
          "form edge split cav");
      if (transcript) {
        REF_BOOL normdev_improved;
        RSS(ref_cavity_normdev(ref_cavity, &normdev_improved), "nd");
        printf("form cavity status %d min normdev %f\n",
               (int)ref_cavity_state(ref_cavity),
               ref_cavity_min_normdev(ref_cavity));
      }
      if (REF_SUCCESS != ref_cavity_enlarge_combined(ref_cavity)) {
        RSS(ref_grid_tattle(ref_grid, node0), "tattle node0");
        RSS(ref_grid_tattle(ref_grid, node1), "tattle node1");
        REF_WHERE("enlarge"); /* note but skip cavity failures */
      }
      if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
        if (transcript) printf("cavity visible\n");
        RSS(ref_cavity_ratio(ref_cavity, &allowed_cavity_ratio),
            "cavity ratio");
        RSS(ref_cavity_change(ref_cavity, &min_del, &min_add), "cavity change");
        valid_cavity =
            (allowed_cavity_ratio || has_edge) &&
            (min_add > ref_grid_adapt(ref_grid, split_quality_absolute));
        if (transcript && !valid_cavity)
          printf("valid_cavity edge %d ratio %d add %d %f\n", has_edge,
                 allowed_cavity_ratio,
                 (min_add > ref_grid_adapt(ref_grid, split_quality_absolute)),
                 min_add);

        if (valid_cavity) {
          if (transcript) printf("cavity replace\n");
          RSS(ref_cavity_replace(ref_cavity), "cav replace");
          RSS(ref_cavity_free(ref_cavity), "cav free");
          ref_cavity = (REF_CAVITY)NULL;
          ref_node_age(ref_node, node0) = 0;
          ref_node_age(ref_node, node1) = 0;
          RSS(ref_smooth_post_edge_split(ref_grid, new_node),
              "smooth after split");
          continue;
        }
      } else {
        if (transcript) {
          REF_BOOL normdev_improved;
          RSS(ref_cavity_normdev(ref_cavity, &normdev_improved), "nd");
          printf("cavity not visible %d\n", (int)ref_cavity_state(ref_cavity));
        }
      }
      if (REF_CAVITY_PARTITION_CONSTRAINED == ref_cavity_state(ref_cavity)) {
        if (span_parts) RSS(ref_list_push(para_cavity, edge), "push");
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
      ref_cavity = (REF_CAVITY)NULL;
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }

    RSS(ref_cell_local_gem(ref_cell, ref_node, node0, node1, &allowed_local),
        "local tet");
    if (!allowed_local) {
      if (span_parts) {
        RSS(ref_list_push(para_no_geom, edge), "push");
      } else {
        ref_node_age(ref_node, node0)++;
        ref_node_age(ref_node, node1)++;
      }
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }

    if (transcript) printf("split\n");
    status = ref_split_edge(ref_grid, node0, node1, new_node);
    if (REF_INCREASE_LIMIT == status) {
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }
    RSS(status, "tet edge split");

    if (transcript)
      RSS(ref_split_edge_ratio_post_report(ref_grid, node0, node1, new_node),
          "report ratio");
    ref_node_age(ref_node, node0) = 0;
    ref_node_age(ref_node, node1) = 0;

    RSS(ref_smooth_post_edge_split(ref_grid, new_node), "smooth after split");
  }

  ref_free(edges);
  ref_free(order);
  ref_free(ratio);

  if (span_parts) {
    if (ref_grid_adapt(ref_grid, timing_level) > 0)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "spl int");
    RSS(ref_subdiv_create(&ref_subdiv, ref_grid), "create");
    ref_subdiv_new_mark_allowed(ref_subdiv) = REF_FALSE;
    ref_subdiv->instrument = REF_TRUE;
    each_ref_list_item(para_no_geom, i) {
      edge = ref_list_value(para_no_geom, i);
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &allowed),
          "has side");
      if (!allowed) continue;

      RSS(ref_subdiv_mark_to_split(ref_subdiv, node0, node1),
          "mark edge to para split");
    }

    RSS(ref_subdiv_split(ref_subdiv), "split");
    RSS(ref_subdiv_free(ref_subdiv), "free");

    {
      REF_INT n_cavity;
      n_cavity = ref_list_n(para_cavity);
      RSS(ref_mpi_allsum(ref_mpi, &n_cavity, 1, REF_INT_TYPE), "cavs");
      if (ref_mpi_once(ref_mpi))
        printf("cavities with part constraints %d\n", n_cavity);
    }

    ref_list_free(para_no_geom);
    ref_list_free(para_cavity);
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}